

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadtexture.hpp
# Opt level: O3

GLuint create_2D_float_texture
                 (int width,int height,int n_channel,float *data,GLint sample_method,bool gen_mipmap
                 )

{
  undefined8 in_RAX;
  GLint GVar1;
  GLenum GVar2;
  GLuint texture;
  
  texture = (GLuint)((ulong)in_RAX >> 0x20);
  (*glad_glGenTextures)(1,&texture);
  (*glad_glBindTexture)(0xde1,texture);
  (*glad_glTexParameteri)(0xde1,0x2801,sample_method);
  (*glad_glTexParameteri)(0xde1,0x2800,sample_method);
  (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
  (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
  if (n_channel == 4) {
    GVar1 = 0x8814;
    GVar2 = 0x1908;
  }
  else if (n_channel == 3) {
    GVar1 = 0x8815;
    GVar2 = 0x1907;
  }
  else {
    if (n_channel != 1) goto LAB_001555a9;
    GVar1 = 0x822e;
    GVar2 = 0x1903;
  }
  (*glad_glTexImage2D)(0xde1,0,GVar1,width,height,0,GVar2,0x1406,data);
LAB_001555a9:
  if (gen_mipmap) {
    (*glad_glGenerateMipmap)(0xde1);
  }
  return texture;
}

Assistant:

GLuint create_2D_float_texture(int width, int height, int n_channel, const float* data, GLint sample_method, bool gen_mipmap = false)
{
	// create & bind a named texture
	GLuint texture;
	glGenTextures(1, &texture);  
	glBindTexture(GL_TEXTURE_2D, texture);
	// set the texture wrapping/filtering options (on the currently bound texture object)
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, sample_method);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, sample_method);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);	
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	// generate the texture
	if (n_channel==1) glTexImage2D(GL_TEXTURE_2D, 0, GL_R32F, width, height, 0, GL_RED, GL_FLOAT, data);
	if (n_channel==3) glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB32F, width, height, 0, GL_RGB, GL_FLOAT, data);
	if (n_channel==4) glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, width, height, 0, GL_RGBA, GL_FLOAT, data);
	if (gen_mipmap)
		glGenerateMipmap(GL_TEXTURE_2D);
	return texture;
}